

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Qualifier.cpp
# Opt level: O3

void __thiscall
Refal2::CQualifier::printLabels(CQualifier *this,ostream *outputStream,CPrintHelper *printHelper)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  _Rb_tree_node_base *p_Var3;
  char *pcVar4;
  bool bVar5;
  set<int,_std::less<int>,_std::allocator<int>_> a;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  if (((this->flags & 4) != 0) && ((this->labels).elementsSize != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(outputStream,"(",1);
  }
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  CFastSet<int>::GetSet(&this->labels,(CSet *)&local_60);
  for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    std::__ostream_insert<char,std::char_traits<char>>(outputStream,"/",1);
    (*printHelper->_vptr_CPrintHelper[1])(printHelper,outputStream,(ulong)p_Var3[1]._M_color);
    std::__ostream_insert<char,std::char_traits<char>>(outputStream,"/",1);
  }
  uVar2 = this->flags;
  if (((uVar2 & 4) != 0) && ((this->labels).elementsSize != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(outputStream,")",1);
    uVar2 = this->flags;
  }
  bVar5 = (uVar2 & 4) == 0;
  pcVar4 = "F ";
  if (bVar5) {
    pcVar4 = "(F) ";
  }
  std::__ostream_insert<char,std::char_traits<char>>(outputStream,pcVar4,(ulong)bVar5 * 2 + 2);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void CQualifier::printLabels( std::ostream& outputStream,
	const CPrintHelper& printHelper ) const
{
	if( IsIncludeAllLabels() && !labels.IsEmpty() ) {
		outputStream << "(";
	}

	std::set<TLabel> a;
	labels.GetSet( &a );
	for( std::set<TLabel>::const_iterator i = a.begin(); i != a.end(); ++i ) {
		outputStream << "/";
		printHelper.Label( outputStream, *i );
		outputStream << "/";
	}

	if( IsIncludeAllLabels() && !labels.IsEmpty() ) {
		outputStream << ")";
	}

	if( IsIncludeAllLabels() ) {
		outputStream << "F ";
	} else {
		outputStream << "(F) ";
	}
}